

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O3

void __thiscall L18_1::Useless::~Useless(Useless *this)

{
  long *plVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\ndestructor called, instance left: ",0x23);
  count = count + -1;
  plVar1 = (long *)std::ostream::operator<<(&std::cout,count);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"deleted one: \n",0xe);
  showObject(this);
  if (this->pc != (char *)0x0) {
    operator_delete__(this->pc);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

Useless::~Useless() {
        cout << "\ndestructor called, instance left: " << --count << endl;
        cout << "deleted one: \n";
        showObject();
        delete [] pc;   //  delete the one created by 'new'

        cout << endl;
    }